

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O0

int inflateGetHeader(z_streamp strm,gz_headerp head)

{
  int iVar1;
  inflate_state *state;
  gz_headerp head_local;
  z_streamp strm_local;
  
  iVar1 = inflateStateCheck(strm);
  if (iVar1 == 0) {
    if (((ulong)strm->state->pending_buf & 2) == 0) {
      strm_local._4_4_ = -2;
    }
    else {
      *(gz_headerp *)&strm->state->wrap = head;
      head->done = 0;
      strm_local._4_4_ = 0;
    }
  }
  else {
    strm_local._4_4_ = -2;
  }
  return strm_local._4_4_;
}

Assistant:

int ZEXPORT inflateGetHeader(z_streamp strm, gz_headerp head) {
    struct inflate_state FAR *state;

    /* check state */
    if (inflateStateCheck(strm)) return Z_STREAM_ERROR;
    state = (struct inflate_state FAR *)strm->state;
    if ((state->wrap & 2) == 0) return Z_STREAM_ERROR;

    /* save header structure */
    state->head = head;
    head->done = 0;
    return Z_OK;
}